

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool has_attribute(element_t *element,int id)

{
  attribute *local_28;
  attribute_t *attribute;
  int id_local;
  element_t *element_local;
  
  local_28 = element->attributes;
  while( true ) {
    if (local_28 == (attribute *)0x0) {
      return false;
    }
    if (local_28->id == id) break;
    local_28 = local_28->next;
  }
  return true;
}

Assistant:

static inline bool has_attribute(const element_t* element, int id)
{
    const attribute_t* attribute = element->attributes;
    while(attribute != NULL) {
        if(attribute->id == id)
            return true;
        attribute = attribute->next;
    }

    return false;
}